

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O2

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::character<'['>::invoke
          (result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  const_iterator f;
  region local_b0;
  region local_68;
  
  f._M_current = (loc->iter_)._M_current;
  if ((f._M_current ==
       (((loc->source_).
         super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_finish) || (*f._M_current != '[')) {
    __return_storage_ptr__->is_ok_ = false;
  }
  else {
    location::advance(loc,1);
    region::region(&local_b0,loc,f,(const_iterator)(loc->iter_)._M_current);
    region::region(&local_68,&local_b0);
    result<toml::detail::region,_toml::detail::none_t>::result
              (__return_storage_ptr__,(success_type *)&local_68);
    region::~region(&local_68);
    region::~region(&local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        if(loc.iter() == loc.end()) {return none();}
        const auto first = loc.iter();

        const char c = *(loc.iter());
        if(c != target)
        {
            return none();
        }
        loc.advance(); // update location

        return ok(region(loc, first, loc.iter()));
    }